

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rotate_bspline.h
# Opt level: O3

vector<Rotate_BSpline_Segment_*,_std::allocator<Rotate_BSpline_Segment_*>_> *
Rotate_BSpline(vector<Rotate_BSpline_Segment_*,_std::allocator<Rotate_BSpline_Segment_*>_>
               *__return_storage_ptr__,Vector3f *o,
              vector<Vector2f,_std::allocator<Vector2f>_> *controls,Material *m,int K)

{
  vector<Vector2f,_std::allocator<Vector2f>_> *this;
  undefined1 (*pauVar1) [64];
  pointer pVVar2;
  pointer pdVar3;
  iterator __position;
  bool bVar4;
  pointer pdVar5;
  undefined8 uVar6;
  uint uVar7;
  Rotate_BSpline_Segment *this_00;
  float *pfVar8;
  Vector2f *x_2;
  Vector2f *this_01;
  pointer pVVar9;
  int iVar10;
  ulong uVar11;
  const_iterator __end3;
  ulong uVar12;
  Vector2f *x;
  ulong uVar13;
  long lVar14;
  pointer pVVar15;
  ulong uVar16;
  long lVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [64];
  undefined1 auVar20 [64];
  undefined1 auVar21 [64];
  undefined1 auVar22 [64];
  undefined1 auVar23 [64];
  pointer pVVar27;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined8 in_XMM4_Qb;
  initializer_list<Vector2f> __l;
  initializer_list<Vector2f> __l_00;
  Vector2f g_2;
  Rotate_BSpline_Segment *s_p;
  Vector2f g;
  vector<std::vector<Vector2f,_std::allocator<Vector2f>_>,_std::allocator<std::vector<Vector2f,_std::allocator<Vector2f>_>_>_>
  f;
  vector<Vector2f,_std::allocator<Vector2f>_> local_388;
  double local_368;
  uint local_35c;
  vector<Vector2f,_std::allocator<Vector2f>_> local_358;
  double local_338;
  uint local_32c;
  vector<Vector2f,_std::allocator<Vector2f>_> local_328;
  vector<double,_std::allocator<double>_> local_308;
  vector<Rotate_BSpline_Segment*,std::allocator<Rotate_BSpline_Segment*>> *local_2f0;
  ulong local_2e8;
  ulong local_2e0;
  Rotate_BSpline_Segment *local_2d8;
  int local_2d0;
  float local_2cc;
  double local_2c8;
  Vector2f local_2b8;
  Vector2f local_2b0;
  undefined1 local_2a8 [16];
  pointer local_298;
  vector<Vector2f,_std::allocator<Vector2f>_> local_288;
  vector<Vector2f,_std::allocator<Vector2f>_> local_268;
  vector<Vector2f,_std::allocator<Vector2f>_> local_248;
  vector<std::vector<Vector2f,_std::allocator<Vector2f>_>,_std::allocator<std::vector<Vector2f,_std::allocator<Vector2f>_>_>_>
  local_230;
  ulong local_218;
  ulong local_210;
  ulong local_208;
  vector<Vector2f,_std::allocator<Vector2f>_> *local_200;
  long local_1f8;
  ulong local_1f0;
  Vector3f *local_1e8;
  Material *local_1e0;
  ulong local_1d8;
  ulong local_1d0;
  ulong local_1c8;
  Vector2f local_1c0;
  vector<Vector2f,_std::allocator<Vector2f>_> local_1b8;
  vector<Vector2f,_std::allocator<Vector2f>_> local_198;
  vector<Vector2f,_std::allocator<Vector2f>_> local_178;
  vector<Vector2f,_std::allocator<Vector2f>_> local_158;
  vector<Vector2f,_std::allocator<Vector2f>_> local_138;
  vector<Vector2f,_std::allocator<Vector2f>_> local_120;
  vector<Vector2f,_std::allocator<Vector2f>_> local_108;
  vector<Vector2f,_std::allocator<Vector2f>_> local_f0;
  vector<Vector2f,_std::allocator<Vector2f>_> local_d8;
  vector<Vector2f,_std::allocator<Vector2f>_> local_c0;
  undefined1 local_a8 [16];
  vector<Vector2f,_std::allocator<Vector2f>_> local_98;
  vector<Vector2f,_std::allocator<Vector2f>_> local_80;
  vector<Vector2f,_std::allocator<Vector2f>_> local_68;
  vector<Vector2f,_std::allocator<Vector2f>_> local_50;
  Vector2f local_38;
  
  uVar11 = (ulong)(uint)K;
  uVar13 = (ulong)((long)(controls->super__Vector_base<Vector2f,_std::allocator<Vector2f>_>)._M_impl
                         .super__Vector_impl_data._M_finish -
                  (long)(controls->super__Vector_base<Vector2f,_std::allocator<Vector2f>_>)._M_impl.
                        super__Vector_impl_data._M_start) >> 3;
  uVar7 = (uint)uVar13;
  local_210 = (ulong)(uVar7 + K);
  local_200 = controls;
  local_1e8 = o;
  local_1e0 = m;
  std::
  vector<std::vector<Vector2f,_std::allocator<Vector2f>_>,_std::allocator<std::vector<Vector2f,_std::allocator<Vector2f>_>_>_>
  ::vector(&local_230,(long)(int)(uVar7 + K),(allocator_type *)&local_328);
  (__return_storage_ptr__->
  super__Vector_base<Rotate_BSpline_Segment_*,_std::allocator<Rotate_BSpline_Segment_*>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<Rotate_BSpline_Segment_*,_std::allocator<Rotate_BSpline_Segment_*>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<Rotate_BSpline_Segment_*,_std::allocator<Rotate_BSpline_Segment_*>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2f0 = (vector<Rotate_BSpline_Segment*,std::allocator<Rotate_BSpline_Segment*>> *)
              __return_storage_ptr__;
  local_2e8 = uVar13;
  local_218 = uVar11;
  if (K < (int)uVar7) {
    local_2d0 = (int)local_210 + -1;
    local_a8._0_8_ = (double)(int)local_210;
    local_1d0 = local_210 & 0xffffffff;
    local_1f0 = (ulong)(uVar7 & 0x7fffffff);
    local_2cc = (float)K;
    local_a8._8_8_ = local_a8._0_8_;
    local_1d8 = (ulong)(K + 1);
    local_35c = K;
    local_2c8 = local_a8._0_8_;
    local_208 = uVar11;
    do {
      if (-1 < local_2d0) {
        uVar13 = (ulong)local_35c;
        lVar14 = 0;
        uVar11 = 0;
        do {
          pVVar2 = *(pointer *)
                    ((long)&((local_230.
                              super__Vector_base<std::vector<Vector2f,_std::allocator<Vector2f>_>,_std::allocator<std::vector<Vector2f,_std::allocator<Vector2f>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)->
                            super__Vector_base<Vector2f,_std::allocator<Vector2f>_>)._M_impl.
                            super__Vector_impl_data._M_start + lVar14);
          this = (vector<Vector2f,_std::allocator<Vector2f>_> *)
                 ((long)&((local_230.
                           super__Vector_base<std::vector<Vector2f,_std::allocator<Vector2f>_>,_std::allocator<std::vector<Vector2f,_std::allocator<Vector2f>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->
                         super__Vector_base<Vector2f,_std::allocator<Vector2f>_>)._M_impl.
                         super__Vector_impl_data._M_start + lVar14);
          if (*(pointer *)
               ((long)&((local_230.
                         super__Vector_base<std::vector<Vector2f,_std::allocator<Vector2f>_>,_std::allocator<std::vector<Vector2f,_std::allocator<Vector2f>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->
                       super__Vector_base<Vector2f,_std::allocator<Vector2f>_>)._M_impl.
                       super__Vector_impl_data._M_finish + lVar14) != pVVar2) {
            (this->super__Vector_base<Vector2f,_std::allocator<Vector2f>_>)._M_impl.
            super__Vector_impl_data._M_finish = pVVar2;
          }
          if (uVar13 == uVar11) {
            Vector2f::Vector2f((Vector2f *)&local_328,1.0);
            std::vector<Vector2f,_std::allocator<Vector2f>_>::emplace_back<Vector2f>
                      (this,(Vector2f *)&local_328);
          }
          uVar11 = uVar11 + 1;
          lVar14 = lVar14 + 0x18;
        } while (local_1d0 != uVar11);
      }
      local_328.super__Vector_base<Vector2f,_std::allocator<Vector2f>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_328.super__Vector_base<Vector2f,_std::allocator<Vector2f>_>._M_impl.
      super__Vector_impl_data._M_start = (Vector2f *)0x0;
      local_328.super__Vector_base<Vector2f,_std::allocator<Vector2f>_>._M_impl.
      super__Vector_impl_data._M_finish = (Vector2f *)0x0;
      if (0 < (int)local_218) {
        lVar14 = -1;
        uVar11 = 1;
        do {
          local_32c = (int)local_210 + (int)lVar14;
          local_2e0 = uVar11;
          local_1f8 = lVar14;
          if (uVar11 == local_208) {
            if (0 < (int)local_32c) {
              local_1c8 = (ulong)local_32c;
              uVar11 = 0;
              do {
                std::vector<Vector2f,_std::allocator<Vector2f>_>::vector(&local_c0,&local_328);
                std::vector<Vector2f,_std::allocator<Vector2f>_>::vector
                          (&local_248,
                           local_230.
                           super__Vector_base<std::vector<Vector2f,_std::allocator<Vector2f>_>,_std::allocator<std::vector<Vector2f,_std::allocator<Vector2f>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start + uVar11);
                pVVar2 = local_248.super__Vector_base<Vector2f,_std::allocator<Vector2f>_>._M_impl.
                         super__Vector_impl_data._M_finish;
                iVar10 = (int)uVar11 + (int)local_208;
                pVVar9 = local_248.super__Vector_base<Vector2f,_std::allocator<Vector2f>_>._M_impl.
                         super__Vector_impl_data._M_start;
                pVVar27 = local_248.super__Vector_base<Vector2f,_std::allocator<Vector2f>_>._M_impl.
                          super__Vector_impl_data._M_finish;
                if (local_248.super__Vector_base<Vector2f,_std::allocator<Vector2f>_>._M_impl.
                    super__Vector_impl_data._M_start !=
                    local_248.super__Vector_base<Vector2f,_std::allocator<Vector2f>_>._M_impl.
                    super__Vector_impl_data._M_finish) {
                  local_368 = (double)CONCAT44(local_368._4_4_,
                                               (float)(1.0 / ((double)iVar10 / local_2c8 -
                                                             (double)(int)uVar11 / local_2c8)));
                  pVVar15 = local_248.super__Vector_base<Vector2f,_std::allocator<Vector2f>_>.
                            _M_impl.super__Vector_impl_data._M_start;
                  do {
                    Vector2f::operator*=(pVVar15,local_368._0_4_);
                    pVVar15 = pVVar15 + 1;
                    pVVar9 = local_248.super__Vector_base<Vector2f,_std::allocator<Vector2f>_>.
                             _M_impl.super__Vector_impl_data._M_start;
                    pVVar27 = local_248.super__Vector_base<Vector2f,_std::allocator<Vector2f>_>.
                              _M_impl.super__Vector_impl_data._M_finish;
                  } while (pVVar15 != pVVar2);
                }
                local_158.super__Vector_base<Vector2f,_std::allocator<Vector2f>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage =
                     local_248.super__Vector_base<Vector2f,_std::allocator<Vector2f>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage;
                uVar11 = uVar11 + 1;
                local_248.super__Vector_base<Vector2f,_std::allocator<Vector2f>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                local_248.super__Vector_base<Vector2f,_std::allocator<Vector2f>_>._M_impl.
                super__Vector_impl_data._M_start = (Vector2f *)0x0;
                local_248.super__Vector_base<Vector2f,_std::allocator<Vector2f>_>._M_impl.
                super__Vector_impl_data._M_finish = (Vector2f *)0x0;
                local_158.super__Vector_base<Vector2f,_std::allocator<Vector2f>_>._M_impl.
                super__Vector_impl_data._M_start = pVVar9;
                local_158.super__Vector_base<Vector2f,_std::allocator<Vector2f>_>._M_impl.
                super__Vector_impl_data._M_finish = pVVar27;
                std::vector<Vector2f,_std::allocator<Vector2f>_>::vector
                          (&local_268,
                           local_230.
                           super__Vector_base<std::vector<Vector2f,_std::allocator<Vector2f>_>,_std::allocator<std::vector<Vector2f,_std::allocator<Vector2f>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start + uVar11);
                pVVar2 = local_268.super__Vector_base<Vector2f,_std::allocator<Vector2f>_>._M_impl.
                         super__Vector_impl_data._M_finish;
                pVVar9 = local_268.super__Vector_base<Vector2f,_std::allocator<Vector2f>_>._M_impl.
                         super__Vector_impl_data._M_start;
                pVVar27 = local_268.super__Vector_base<Vector2f,_std::allocator<Vector2f>_>._M_impl.
                          super__Vector_impl_data._M_finish;
                if (local_268.super__Vector_base<Vector2f,_std::allocator<Vector2f>_>._M_impl.
                    super__Vector_impl_data._M_start !=
                    local_268.super__Vector_base<Vector2f,_std::allocator<Vector2f>_>._M_impl.
                    super__Vector_impl_data._M_finish) {
                  local_368 = (double)CONCAT44(local_368._4_4_,
                                               (float)(1.0 / ((double)(iVar10 + 1) / local_2c8 -
                                                             (double)(int)uVar11 / local_2c8)));
                  pVVar15 = local_268.super__Vector_base<Vector2f,_std::allocator<Vector2f>_>.
                            _M_impl.super__Vector_impl_data._M_start;
                  do {
                    Vector2f::operator*=(pVVar15,local_368._0_4_);
                    pVVar15 = pVVar15 + 1;
                    pVVar9 = local_268.super__Vector_base<Vector2f,_std::allocator<Vector2f>_>.
                             _M_impl.super__Vector_impl_data._M_start;
                    pVVar27 = local_268.super__Vector_base<Vector2f,_std::allocator<Vector2f>_>.
                              _M_impl.super__Vector_impl_data._M_finish;
                  } while (pVVar15 != pVVar2);
                }
                local_178.super__Vector_base<Vector2f,_std::allocator<Vector2f>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage =
                     local_268.super__Vector_base<Vector2f,_std::allocator<Vector2f>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage;
                local_268.super__Vector_base<Vector2f,_std::allocator<Vector2f>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                local_268.super__Vector_base<Vector2f,_std::allocator<Vector2f>_>._M_impl.
                super__Vector_impl_data._M_start = (Vector2f *)0x0;
                local_268.super__Vector_base<Vector2f,_std::allocator<Vector2f>_>._M_impl.
                super__Vector_impl_data._M_finish = (Vector2f *)0x0;
                local_178.super__Vector_base<Vector2f,_std::allocator<Vector2f>_>._M_impl.
                super__Vector_impl_data._M_start = pVVar9;
                local_178.super__Vector_base<Vector2f,_std::allocator<Vector2f>_>._M_impl.
                super__Vector_impl_data._M_finish = pVVar27;
                poly_minus<Vector2f>(&local_d8,&local_158,&local_178);
                operator*(&local_1c0,local_2cc);
                poly_mul<Vector2f>(&local_50,&local_d8,&local_1c0);
                poly_add<Vector2f>(&local_358,&local_c0,&local_50);
                pVVar2 = local_328.super__Vector_base<Vector2f,_std::allocator<Vector2f>_>._M_impl.
                         super__Vector_impl_data._M_start;
                local_328.super__Vector_base<Vector2f,_std::allocator<Vector2f>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage =
                     local_358.super__Vector_base<Vector2f,_std::allocator<Vector2f>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage;
                local_358.super__Vector_base<Vector2f,_std::allocator<Vector2f>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                local_328.super__Vector_base<Vector2f,_std::allocator<Vector2f>_>._M_impl.
                super__Vector_impl_data._M_start =
                     local_358.super__Vector_base<Vector2f,_std::allocator<Vector2f>_>._M_impl.
                     super__Vector_impl_data._M_start;
                local_328.super__Vector_base<Vector2f,_std::allocator<Vector2f>_>._M_impl.
                super__Vector_impl_data._M_finish =
                     local_358.super__Vector_base<Vector2f,_std::allocator<Vector2f>_>._M_impl.
                     super__Vector_impl_data._M_finish;
                local_358.super__Vector_base<Vector2f,_std::allocator<Vector2f>_>._M_impl.
                super__Vector_impl_data._M_start = (Vector2f *)0x0;
                local_358.super__Vector_base<Vector2f,_std::allocator<Vector2f>_>._M_impl.
                super__Vector_impl_data._M_finish = (Vector2f *)0x0;
                if ((pVVar2 != (Vector2f *)0x0) &&
                   (operator_delete(pVVar2),
                   local_358.super__Vector_base<Vector2f,_std::allocator<Vector2f>_>._M_impl.
                   super__Vector_impl_data._M_start != (Vector2f *)0x0)) {
                  operator_delete(local_358.super__Vector_base<Vector2f,_std::allocator<Vector2f>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
                }
                if (local_50.super__Vector_base<Vector2f,_std::allocator<Vector2f>_>._M_impl.
                    super__Vector_impl_data._M_start != (pointer)0x0) {
                  operator_delete(local_50.super__Vector_base<Vector2f,_std::allocator<Vector2f>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
                }
                if (local_d8.super__Vector_base<Vector2f,_std::allocator<Vector2f>_>._M_impl.
                    super__Vector_impl_data._M_start != (pointer)0x0) {
                  operator_delete(local_d8.super__Vector_base<Vector2f,_std::allocator<Vector2f>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
                }
                if (local_178.super__Vector_base<Vector2f,_std::allocator<Vector2f>_>._M_impl.
                    super__Vector_impl_data._M_start != (Vector2f *)0x0) {
                  operator_delete(local_178.super__Vector_base<Vector2f,_std::allocator<Vector2f>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
                }
                if (local_268.super__Vector_base<Vector2f,_std::allocator<Vector2f>_>._M_impl.
                    super__Vector_impl_data._M_start != (Vector2f *)0x0) {
                  operator_delete(local_268.super__Vector_base<Vector2f,_std::allocator<Vector2f>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
                }
                if (local_158.super__Vector_base<Vector2f,_std::allocator<Vector2f>_>._M_impl.
                    super__Vector_impl_data._M_start != (Vector2f *)0x0) {
                  operator_delete(local_158.super__Vector_base<Vector2f,_std::allocator<Vector2f>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
                }
                if (local_248.super__Vector_base<Vector2f,_std::allocator<Vector2f>_>._M_impl.
                    super__Vector_impl_data._M_start != (Vector2f *)0x0) {
                  operator_delete(local_248.super__Vector_base<Vector2f,_std::allocator<Vector2f>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
                }
                if (local_c0.super__Vector_base<Vector2f,_std::allocator<Vector2f>_>._M_impl.
                    super__Vector_impl_data._M_start != (pointer)0x0) {
                  operator_delete(local_c0.super__Vector_base<Vector2f,_std::allocator<Vector2f>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
                }
              } while (uVar11 < local_1c8);
              goto LAB_00160291;
            }
          }
          else {
LAB_00160291:
            lVar14 = local_1f8;
            uVar11 = local_2e0;
            if (0 < (int)local_32c) {
              uVar16 = (ulong)local_32c;
              uVar13 = 0;
              do {
                std::vector<Vector2f,_std::allocator<Vector2f>_>::vector
                          (&local_108,
                           local_230.
                           super__Vector_base<std::vector<Vector2f,_std::allocator<Vector2f>_>,_std::allocator<std::vector<Vector2f,_std::allocator<Vector2f>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start + uVar13);
                auVar24._0_8_ = (double)(int)uVar13 / local_2c8;
                auVar24._8_8_ = in_XMM4_Qb;
                auVar25._0_4_ = (float)auVar24._0_8_;
                auVar25._4_12_ = auVar24._4_12_;
                auVar18._8_4_ = 0x80000000;
                auVar18._0_8_ = 0x8000000080000000;
                auVar18._12_4_ = 0x80000000;
                auVar18 = vxorps_avx512vl(auVar25,auVar18);
                local_368 = auVar24._0_8_;
                Vector2f::Vector2f((Vector2f *)&local_388,auVar18._0_4_,auVar18._0_4_);
                Vector2f::Vector2f((Vector2f *)
                                   &local_388.
                                    super__Vector_base<Vector2f,_std::allocator<Vector2f>_>._M_impl.
                                    super__Vector_impl_data._M_finish,1.0,1.0);
                __l._M_len = 2;
                __l._M_array = (iterator)&local_388;
                std::vector<Vector2f,_std::allocator<Vector2f>_>::vector
                          (&local_288,__l,(allocator_type *)&local_338);
                pVVar2 = local_288.super__Vector_base<Vector2f,_std::allocator<Vector2f>_>._M_impl.
                         super__Vector_impl_data._M_finish;
                iVar10 = (int)uVar13 + (int)local_2e0;
                if (local_288.super__Vector_base<Vector2f,_std::allocator<Vector2f>_>._M_impl.
                    super__Vector_impl_data._M_start !=
                    local_288.super__Vector_base<Vector2f,_std::allocator<Vector2f>_>._M_impl.
                    super__Vector_impl_data._M_finish) {
                  local_368 = (double)CONCAT44(local_368._4_4_,
                                               (float)(1.0 / ((double)iVar10 / local_2c8 - local_368
                                                             )));
                  pVVar9 = local_288.super__Vector_base<Vector2f,_std::allocator<Vector2f>_>._M_impl
                           .super__Vector_impl_data._M_start;
                  do {
                    Vector2f::operator*=(pVVar9,local_368._0_4_);
                    pVVar9 = pVVar9 + 1;
                  } while (pVVar9 != pVVar2);
                }
                local_198.super__Vector_base<Vector2f,_std::allocator<Vector2f>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage =
                     local_288.super__Vector_base<Vector2f,_std::allocator<Vector2f>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage;
                local_288.super__Vector_base<Vector2f,_std::allocator<Vector2f>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                local_198.super__Vector_base<Vector2f,_std::allocator<Vector2f>_>._M_impl.
                super__Vector_impl_data._M_start =
                     local_288.super__Vector_base<Vector2f,_std::allocator<Vector2f>_>._M_impl.
                     super__Vector_impl_data._M_start;
                local_198.super__Vector_base<Vector2f,_std::allocator<Vector2f>_>._M_impl.
                super__Vector_impl_data._M_finish =
                     local_288.super__Vector_base<Vector2f,_std::allocator<Vector2f>_>._M_impl.
                     super__Vector_impl_data._M_finish;
                local_288.super__Vector_base<Vector2f,_std::allocator<Vector2f>_>._M_impl.
                super__Vector_impl_data._M_start = (Vector2f *)0x0;
                local_288.super__Vector_base<Vector2f,_std::allocator<Vector2f>_>._M_impl.
                super__Vector_impl_data._M_finish = (Vector2f *)0x0;
                poly_mul<Vector2f>(&local_f0,&local_108,&local_198);
                uVar12 = uVar13 + 1;
                std::vector<Vector2f,_std::allocator<Vector2f>_>::vector
                          (&local_120,
                           local_230.
                           super__Vector_base<std::vector<Vector2f,_std::allocator<Vector2f>_>,_std::allocator<std::vector<Vector2f,_std::allocator<Vector2f>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start + uVar12);
                local_368 = (double)(iVar10 + 1) / local_2c8;
                Vector2f::Vector2f(&local_2b8,(float)local_368,(float)local_368);
                Vector2f::Vector2f(&local_2b0,-1.0,-1.0);
                __l_00._M_len = 2;
                __l_00._M_array = &local_2b8;
                std::vector<Vector2f,_std::allocator<Vector2f>_>::vector
                          ((vector<Vector2f,_std::allocator<Vector2f>_> *)local_2a8,__l_00,
                           (allocator_type *)&local_2d8);
                uVar6 = local_2a8._8_8_;
                if (local_2a8._0_8_ != local_2a8._8_8_) {
                  local_368 = (double)CONCAT44(local_368._4_4_,
                                               (float)(1.0 / (local_368 -
                                                             (double)(int)uVar12 / local_2c8)));
                  this_01 = (Vector2f *)local_2a8._0_8_;
                  do {
                    Vector2f::operator*=(this_01,local_368._0_4_);
                    this_01 = this_01 + 1;
                  } while (this_01 != (Vector2f *)uVar6);
                }
                local_1b8.super__Vector_base<Vector2f,_std::allocator<Vector2f>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage = local_298;
                local_298 = (pointer)0x0;
                local_1b8.super__Vector_base<Vector2f,_std::allocator<Vector2f>_>._M_impl.
                super__Vector_impl_data._M_finish = (pointer)local_2a8._8_8_;
                local_1b8.super__Vector_base<Vector2f,_std::allocator<Vector2f>_>._M_impl.
                super__Vector_impl_data._M_start = (pointer)local_2a8._0_8_;
                local_2a8 = ZEXT816(0) << 0x20;
                poly_mul<Vector2f>(&local_68,&local_120,&local_1b8);
                poly_add<Vector2f>(&local_358,&local_f0,&local_68);
                pVVar2 = local_230.
                         super__Vector_base<std::vector<Vector2f,_std::allocator<Vector2f>_>,_std::allocator<std::vector<Vector2f,_std::allocator<Vector2f>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[uVar13].
                         super__Vector_base<Vector2f,_std::allocator<Vector2f>_>._M_impl.
                         super__Vector_impl_data._M_start;
                local_230.
                super__Vector_base<std::vector<Vector2f,_std::allocator<Vector2f>_>,_std::allocator<std::vector<Vector2f,_std::allocator<Vector2f>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start[uVar13].
                super__Vector_base<Vector2f,_std::allocator<Vector2f>_>._M_impl.
                super__Vector_impl_data._M_start =
                     local_358.super__Vector_base<Vector2f,_std::allocator<Vector2f>_>._M_impl.
                     super__Vector_impl_data._M_start;
                local_230.
                super__Vector_base<std::vector<Vector2f,_std::allocator<Vector2f>_>,_std::allocator<std::vector<Vector2f,_std::allocator<Vector2f>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start[uVar13].
                super__Vector_base<Vector2f,_std::allocator<Vector2f>_>._M_impl.
                super__Vector_impl_data._M_finish =
                     local_358.super__Vector_base<Vector2f,_std::allocator<Vector2f>_>._M_impl.
                     super__Vector_impl_data._M_finish;
                local_230.
                super__Vector_base<std::vector<Vector2f,_std::allocator<Vector2f>_>,_std::allocator<std::vector<Vector2f,_std::allocator<Vector2f>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start[uVar13].
                super__Vector_base<Vector2f,_std::allocator<Vector2f>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage =
                     local_358.super__Vector_base<Vector2f,_std::allocator<Vector2f>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage;
                local_358.super__Vector_base<Vector2f,_std::allocator<Vector2f>_>._M_impl.
                super__Vector_impl_data._M_start = (Vector2f *)0x0;
                local_358.super__Vector_base<Vector2f,_std::allocator<Vector2f>_>._M_impl.
                super__Vector_impl_data._M_finish = (Vector2f *)0x0;
                local_358.super__Vector_base<Vector2f,_std::allocator<Vector2f>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                if ((pVVar2 != (pointer)0x0) &&
                   (operator_delete(pVVar2),
                   local_358.super__Vector_base<Vector2f,_std::allocator<Vector2f>_>._M_impl.
                   super__Vector_impl_data._M_start != (Vector2f *)0x0)) {
                  operator_delete(local_358.super__Vector_base<Vector2f,_std::allocator<Vector2f>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
                }
                lVar14 = local_1f8;
                uVar11 = local_2e0;
                if (local_68.super__Vector_base<Vector2f,_std::allocator<Vector2f>_>._M_impl.
                    super__Vector_impl_data._M_start != (pointer)0x0) {
                  operator_delete(local_68.super__Vector_base<Vector2f,_std::allocator<Vector2f>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
                }
                if (local_1b8.super__Vector_base<Vector2f,_std::allocator<Vector2f>_>._M_impl.
                    super__Vector_impl_data._M_start != (Vector2f *)0x0) {
                  operator_delete(local_1b8.super__Vector_base<Vector2f,_std::allocator<Vector2f>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
                }
                if ((pointer)local_2a8._0_8_ != (pointer)0x0) {
                  operator_delete((void *)local_2a8._0_8_);
                }
                if (local_120.super__Vector_base<Vector2f,_std::allocator<Vector2f>_>._M_impl.
                    super__Vector_impl_data._M_start != (pointer)0x0) {
                  operator_delete(local_120.super__Vector_base<Vector2f,_std::allocator<Vector2f>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
                }
                if (local_f0.super__Vector_base<Vector2f,_std::allocator<Vector2f>_>._M_impl.
                    super__Vector_impl_data._M_start != (pointer)0x0) {
                  operator_delete(local_f0.super__Vector_base<Vector2f,_std::allocator<Vector2f>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
                }
                if (local_198.super__Vector_base<Vector2f,_std::allocator<Vector2f>_>._M_impl.
                    super__Vector_impl_data._M_start != (Vector2f *)0x0) {
                  operator_delete(local_198.super__Vector_base<Vector2f,_std::allocator<Vector2f>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
                }
                if (local_288.super__Vector_base<Vector2f,_std::allocator<Vector2f>_>._M_impl.
                    super__Vector_impl_data._M_start != (Vector2f *)0x0) {
                  operator_delete(local_288.super__Vector_base<Vector2f,_std::allocator<Vector2f>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
                }
                if (local_108.super__Vector_base<Vector2f,_std::allocator<Vector2f>_>._M_impl.
                    super__Vector_impl_data._M_start != (pointer)0x0) {
                  operator_delete(local_108.super__Vector_base<Vector2f,_std::allocator<Vector2f>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
                }
                uVar13 = uVar12;
              } while (uVar12 < uVar16);
            }
          }
          uVar11 = uVar11 + 1;
          lVar14 = lVar14 + -1;
        } while (uVar11 != local_1d8);
      }
      local_358.super__Vector_base<Vector2f,_std::allocator<Vector2f>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_358.super__Vector_base<Vector2f,_std::allocator<Vector2f>_>._M_impl.
      super__Vector_impl_data._M_start = (Vector2f *)0x0;
      local_358.super__Vector_base<Vector2f,_std::allocator<Vector2f>_>._M_impl.
      super__Vector_impl_data._M_finish = (Vector2f *)0x0;
      if (0 < (int)(uint)local_2e8) {
        lVar14 = 0;
        lVar17 = 0;
        uVar11 = local_1f0;
        do {
          std::vector<Vector2f,_std::allocator<Vector2f>_>::vector(&local_138,&local_358);
          std::vector<Vector2f,_std::allocator<Vector2f>_>::vector
                    (&local_98,
                     (vector<Vector2f,_std::allocator<Vector2f>_> *)
                     ((long)&((local_230.
                               super__Vector_base<std::vector<Vector2f,_std::allocator<Vector2f>_>,_std::allocator<std::vector<Vector2f,_std::allocator<Vector2f>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start)->
                             super__Vector_base<Vector2f,_std::allocator<Vector2f>_>)._M_impl.
                             super__Vector_impl_data._M_start + lVar17));
          Vector2f::Vector2f(&local_38,
                             (Vector2f *)
                             ((long)((local_200->
                                     super__Vector_base<Vector2f,_std::allocator<Vector2f>_>).
                                     _M_impl.super__Vector_impl_data._M_start)->m_elements + lVar14)
                            );
          poly_mul<Vector2f>(&local_80,&local_98,&local_38);
          poly_add<Vector2f>(&local_388,&local_138,&local_80);
          pVVar2 = local_358.super__Vector_base<Vector2f,_std::allocator<Vector2f>_>._M_impl.
                   super__Vector_impl_data._M_start;
          local_358.super__Vector_base<Vector2f,_std::allocator<Vector2f>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage =
               local_388.super__Vector_base<Vector2f,_std::allocator<Vector2f>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
          local_388.super__Vector_base<Vector2f,_std::allocator<Vector2f>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          local_358.super__Vector_base<Vector2f,_std::allocator<Vector2f>_>._M_impl.
          super__Vector_impl_data._M_start =
               local_388.super__Vector_base<Vector2f,_std::allocator<Vector2f>_>._M_impl.
               super__Vector_impl_data._M_start;
          local_358.super__Vector_base<Vector2f,_std::allocator<Vector2f>_>._M_impl.
          super__Vector_impl_data._M_finish =
               local_388.super__Vector_base<Vector2f,_std::allocator<Vector2f>_>._M_impl.
               super__Vector_impl_data._M_finish;
          local_388.super__Vector_base<Vector2f,_std::allocator<Vector2f>_>._M_impl.
          super__Vector_impl_data._M_start = (Vector2f *)0x0;
          local_388.super__Vector_base<Vector2f,_std::allocator<Vector2f>_>._M_impl.
          super__Vector_impl_data._M_finish = (Vector2f *)0x0;
          if ((pVVar2 != (Vector2f *)0x0) &&
             (operator_delete(pVVar2),
             local_388.super__Vector_base<Vector2f,_std::allocator<Vector2f>_>._M_impl.
             super__Vector_impl_data._M_start != (Vector2f *)0x0)) {
            operator_delete(local_388.super__Vector_base<Vector2f,_std::allocator<Vector2f>_>.
                            _M_impl.super__Vector_impl_data._M_start);
          }
          if (local_80.super__Vector_base<Vector2f,_std::allocator<Vector2f>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_80.super__Vector_base<Vector2f,_std::allocator<Vector2f>_>._M_impl
                            .super__Vector_impl_data._M_start);
          }
          if (local_98.super__Vector_base<Vector2f,_std::allocator<Vector2f>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_98.super__Vector_base<Vector2f,_std::allocator<Vector2f>_>._M_impl
                            .super__Vector_impl_data._M_start);
          }
          if (local_138.super__Vector_base<Vector2f,_std::allocator<Vector2f>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_138.super__Vector_base<Vector2f,_std::allocator<Vector2f>_>.
                            _M_impl.super__Vector_impl_data._M_start);
          }
          lVar17 = lVar17 + 0x18;
          lVar14 = lVar14 + 8;
          uVar11 = uVar11 - 1;
        } while (uVar11 != 0);
      }
      this_00 = (Rotate_BSpline_Segment *)operator_new(0xb0);
      Rotate_BSpline_Segment::Rotate_BSpline_Segment(this_00,local_1e0);
      local_2d8 = this_00;
      Vector3f::operator=(&this_00->o,local_1e8);
      pVVar2 = local_358.super__Vector_base<Vector2f,_std::allocator<Vector2f>_>._M_impl.
               super__Vector_impl_data._M_finish;
      auVar26 = SUB6416(ZEXT864(0),0) << 0x40;
      local_388.super__Vector_base<Vector2f,_std::allocator<Vector2f>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_388.super__Vector_base<Vector2f,_std::allocator<Vector2f>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_388.super__Vector_base<Vector2f,_std::allocator<Vector2f>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      pVVar9 = local_358.super__Vector_base<Vector2f,_std::allocator<Vector2f>_>._M_impl.
               super__Vector_impl_data._M_start;
      if (local_358.super__Vector_base<Vector2f,_std::allocator<Vector2f>_>._M_impl.
          super__Vector_impl_data._M_start ==
          local_358.super__Vector_base<Vector2f,_std::allocator<Vector2f>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        local_388.super__Vector_base<Vector2f,_std::allocator<Vector2f>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      }
      else {
        do {
          Vector2f::Vector2f(&local_2b8,pVVar9);
          pfVar8 = Vector2f::operator[](&local_2b8,0);
          local_338 = (double)*pfVar8;
          if (local_388.super__Vector_base<Vector2f,_std::allocator<Vector2f>_>._M_impl.
              super__Vector_impl_data._M_finish ==
              local_388.super__Vector_base<Vector2f,_std::allocator<Vector2f>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                      ((vector<double,_std::allocator<double>_> *)&local_388,
                       (iterator)
                       local_388.super__Vector_base<Vector2f,_std::allocator<Vector2f>_>._M_impl.
                       super__Vector_impl_data._M_finish,&local_338);
          }
          else {
            *local_388.super__Vector_base<Vector2f,_std::allocator<Vector2f>_>._M_impl.
             super__Vector_impl_data._M_finish = (Vector2f)local_338;
            local_388.super__Vector_base<Vector2f,_std::allocator<Vector2f>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 local_388.super__Vector_base<Vector2f,_std::allocator<Vector2f>_>._M_impl.
                 super__Vector_impl_data._M_finish + 1;
          }
          pVVar9 = pVVar9 + 1;
        } while (pVVar9 != pVVar2);
        auVar26._8_8_ =
             local_388.super__Vector_base<Vector2f,_std::allocator<Vector2f>_>._M_impl.
             super__Vector_impl_data._M_finish;
        auVar26._0_8_ =
             local_388.super__Vector_base<Vector2f,_std::allocator<Vector2f>_>._M_impl.
             super__Vector_impl_data._M_start;
      }
      pdVar3 = (this_00->px).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      (this_00->px).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)auVar26._0_8_;
      (this_00->px).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)auVar26._8_8_;
      (this_00->px).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           (pointer)local_388.super__Vector_base<Vector2f,_std::allocator<Vector2f>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage;
      local_388.super__Vector_base<Vector2f,_std::allocator<Vector2f>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_388.super__Vector_base<Vector2f,_std::allocator<Vector2f>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_388.super__Vector_base<Vector2f,_std::allocator<Vector2f>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      if ((pdVar3 != (pointer)0x0) &&
         (operator_delete(pdVar3),
         local_388.super__Vector_base<Vector2f,_std::allocator<Vector2f>_>._M_impl.
         super__Vector_impl_data._M_start != (pointer)0x0)) {
        operator_delete(local_388.super__Vector_base<Vector2f,_std::allocator<Vector2f>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      pVVar2 = local_358.super__Vector_base<Vector2f,_std::allocator<Vector2f>_>._M_impl.
               super__Vector_impl_data._M_finish;
      local_388.super__Vector_base<Vector2f,_std::allocator<Vector2f>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_388.super__Vector_base<Vector2f,_std::allocator<Vector2f>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_388.super__Vector_base<Vector2f,_std::allocator<Vector2f>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      pVVar9 = local_358.super__Vector_base<Vector2f,_std::allocator<Vector2f>_>._M_impl.
               super__Vector_impl_data._M_start;
      if (local_358.super__Vector_base<Vector2f,_std::allocator<Vector2f>_>._M_impl.
          super__Vector_impl_data._M_start ==
          local_358.super__Vector_base<Vector2f,_std::allocator<Vector2f>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        local_388.super__Vector_base<Vector2f,_std::allocator<Vector2f>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_388.super__Vector_base<Vector2f,_std::allocator<Vector2f>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_388.super__Vector_base<Vector2f,_std::allocator<Vector2f>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
      }
      else {
        do {
          Vector2f::Vector2f(&local_2b8,pVVar9);
          pfVar8 = Vector2f::operator[](&local_2b8,1);
          local_338 = (double)*pfVar8;
          if (local_388.super__Vector_base<Vector2f,_std::allocator<Vector2f>_>._M_impl.
              super__Vector_impl_data._M_finish ==
              local_388.super__Vector_base<Vector2f,_std::allocator<Vector2f>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                      ((vector<double,_std::allocator<double>_> *)&local_388,
                       (iterator)
                       local_388.super__Vector_base<Vector2f,_std::allocator<Vector2f>_>._M_impl.
                       super__Vector_impl_data._M_finish,&local_338);
          }
          else {
            *local_388.super__Vector_base<Vector2f,_std::allocator<Vector2f>_>._M_impl.
             super__Vector_impl_data._M_finish = (Vector2f)local_338;
            local_388.super__Vector_base<Vector2f,_std::allocator<Vector2f>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 local_388.super__Vector_base<Vector2f,_std::allocator<Vector2f>_>._M_impl.
                 super__Vector_impl_data._M_finish + 1;
          }
          pVVar9 = pVVar9 + 1;
        } while (pVVar9 != pVVar2);
      }
      pdVar3 = (this_00->py).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      (this_00->py).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start =
           (pointer)local_388.super__Vector_base<Vector2f,_std::allocator<Vector2f>_>._M_impl.
                    super__Vector_impl_data._M_start;
      (this_00->py).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_finish =
           (pointer)local_388.super__Vector_base<Vector2f,_std::allocator<Vector2f>_>._M_impl.
                    super__Vector_impl_data._M_finish;
      (this_00->py).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           (pointer)local_388.super__Vector_base<Vector2f,_std::allocator<Vector2f>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage;
      local_388.super__Vector_base<Vector2f,_std::allocator<Vector2f>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_388.super__Vector_base<Vector2f,_std::allocator<Vector2f>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_388.super__Vector_base<Vector2f,_std::allocator<Vector2f>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      if ((pdVar3 != (pointer)0x0) &&
         (operator_delete(pdVar3),
         local_388.super__Vector_base<Vector2f,_std::allocator<Vector2f>_>._M_impl.
         super__Vector_impl_data._M_start != (pointer)0x0)) {
        operator_delete(local_388.super__Vector_base<Vector2f,_std::allocator<Vector2f>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      pVVar2 = local_328.super__Vector_base<Vector2f,_std::allocator<Vector2f>_>._M_impl.
               super__Vector_impl_data._M_finish;
      local_308.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      local_308.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      local_308.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      pVVar9 = local_328.super__Vector_base<Vector2f,_std::allocator<Vector2f>_>._M_impl.
               super__Vector_impl_data._M_start;
      if (local_328.super__Vector_base<Vector2f,_std::allocator<Vector2f>_>._M_impl.
          super__Vector_impl_data._M_start ==
          local_328.super__Vector_base<Vector2f,_std::allocator<Vector2f>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        local_308.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_308.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
      }
      else {
        do {
          Vector2f::Vector2f((Vector2f *)&local_388,pVVar9);
          pfVar8 = Vector2f::operator[]((Vector2f *)&local_388,1);
          local_2b8.m_elements = (float  [2])(double)*pfVar8;
          if (local_308.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_finish ==
              local_308.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                      (&local_308,
                       (iterator)
                       local_308.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_finish,(double *)&local_2b8);
          }
          else {
            *local_308.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_finish = (double)local_2b8.m_elements;
            local_308.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 local_308.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_finish + 1;
          }
          pVVar9 = pVVar9 + 1;
        } while (pVVar9 != pVVar2);
        if (local_308.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start !=
            local_308.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_finish) {
          auVar19 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
          auVar20 = vbroadcastsd_avx512f(ZEXT816(0x8000000000000000));
          uVar11 = 0;
          auVar21 = vpbroadcastq_avx512f();
          auVar21 = vpsrlq_avx512f(auVar21,3);
          do {
            auVar22 = vpbroadcastq_avx512f();
            auVar22 = vporq_avx512f(auVar22,auVar19);
            uVar13 = vpcmpuq_avx512f(auVar22,auVar21,2);
            pdVar3 = local_308.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start + uVar11;
            auVar22._8_8_ = (ulong)((byte)(uVar13 >> 1) & 1) * (long)pdVar3[1];
            auVar22._0_8_ = (ulong)((byte)uVar13 & 1) * (long)*pdVar3;
            auVar22._16_8_ = (ulong)((byte)(uVar13 >> 2) & 1) * (long)pdVar3[2];
            auVar22._24_8_ = (ulong)((byte)(uVar13 >> 3) & 1) * (long)pdVar3[3];
            auVar22._32_8_ = (ulong)((byte)(uVar13 >> 4) & 1) * (long)pdVar3[4];
            auVar22._40_8_ = (ulong)((byte)(uVar13 >> 5) & 1) * (long)pdVar3[5];
            auVar22._48_8_ = (ulong)((byte)(uVar13 >> 6) & 1) * (long)pdVar3[6];
            auVar22._56_8_ = (uVar13 >> 7) * (long)pdVar3[7];
            auVar22 = vxorpd_avx512dq(auVar22,auVar20);
            pauVar1 = (undefined1 (*) [64])
                      (local_308.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start + uVar11);
            bVar4 = (bool)((byte)uVar13 & 1);
            auVar23._0_8_ = (ulong)bVar4 * auVar22._0_8_ | (ulong)!bVar4 * (long)*(double *)*pauVar1
            ;
            bVar4 = (bool)((byte)(uVar13 >> 1) & 1);
            auVar23._8_8_ =
                 (ulong)bVar4 * auVar22._8_8_ | (ulong)!bVar4 * (long)*(pointer)((long)*pauVar1 + 8)
            ;
            bVar4 = (bool)((byte)(uVar13 >> 2) & 1);
            auVar23._16_8_ =
                 (ulong)bVar4 * auVar22._16_8_ |
                 (ulong)!bVar4 * (long)*(pointer)((long)*pauVar1 + 0x10);
            bVar4 = (bool)((byte)(uVar13 >> 3) & 1);
            auVar23._24_8_ =
                 (ulong)bVar4 * auVar22._24_8_ |
                 (ulong)!bVar4 * (long)*(pointer)((long)*pauVar1 + 0x18);
            bVar4 = (bool)((byte)(uVar13 >> 4) & 1);
            auVar23._32_8_ =
                 (ulong)bVar4 * auVar22._32_8_ |
                 (ulong)!bVar4 * (long)*(pointer)((long)*pauVar1 + 0x20);
            bVar4 = (bool)((byte)(uVar13 >> 5) & 1);
            auVar23._40_8_ =
                 (ulong)bVar4 * auVar22._40_8_ |
                 (ulong)!bVar4 * (long)*(pointer)((long)*pauVar1 + 0x28);
            bVar4 = (bool)((byte)(uVar13 >> 6) & 1);
            auVar23._48_8_ =
                 (ulong)bVar4 * auVar22._48_8_ |
                 (ulong)!bVar4 * (long)*(pointer)((long)*pauVar1 + 0x30);
            auVar23._56_8_ =
                 (uVar13 >> 7) * auVar22._56_8_ |
                 (ulong)!SUB81(uVar13 >> 7,0) * (long)*(pointer)((long)*pauVar1 + 0x38);
            *pauVar1 = auVar23;
            uVar11 = uVar11 + 8;
          } while ((((ulong)((long)local_308.super__Vector_base<double,_std::allocator<double>_>.
                                   _M_impl.super__Vector_impl_data._M_finish +
                            (-8 - (long)local_308.
                                        super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                        super__Vector_impl_data._M_start)) >> 3) + 8 &
                   0xfffffffffffffff8) != uVar11);
        }
      }
      pdVar5 = local_308.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
      pdVar3 = (this_00->nx).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      (this_00->nx).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start =
           local_308.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
      (this_00->nx).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_finish =
           local_308.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish;
      local_308.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      local_308.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      local_308.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      (this_00->nx).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = pdVar5;
      if ((pdVar3 != (pointer)0x0) &&
         (operator_delete(pdVar3),
         local_308.super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_start != (pointer)0x0)) {
        operator_delete(local_308.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      pVVar2 = local_328.super__Vector_base<Vector2f,_std::allocator<Vector2f>_>._M_impl.
               super__Vector_impl_data._M_finish;
      local_388.super__Vector_base<Vector2f,_std::allocator<Vector2f>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_388.super__Vector_base<Vector2f,_std::allocator<Vector2f>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_388.super__Vector_base<Vector2f,_std::allocator<Vector2f>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      pVVar9 = local_328.super__Vector_base<Vector2f,_std::allocator<Vector2f>_>._M_impl.
               super__Vector_impl_data._M_start;
      if (local_328.super__Vector_base<Vector2f,_std::allocator<Vector2f>_>._M_impl.
          super__Vector_impl_data._M_start ==
          local_328.super__Vector_base<Vector2f,_std::allocator<Vector2f>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        local_388.super__Vector_base<Vector2f,_std::allocator<Vector2f>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_388.super__Vector_base<Vector2f,_std::allocator<Vector2f>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_388.super__Vector_base<Vector2f,_std::allocator<Vector2f>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
      }
      else {
        do {
          Vector2f::Vector2f(&local_2b8,pVVar9);
          pfVar8 = Vector2f::operator[](&local_2b8,0);
          local_338 = (double)*pfVar8;
          if (local_388.super__Vector_base<Vector2f,_std::allocator<Vector2f>_>._M_impl.
              super__Vector_impl_data._M_finish ==
              local_388.super__Vector_base<Vector2f,_std::allocator<Vector2f>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                      ((vector<double,_std::allocator<double>_> *)&local_388,
                       (iterator)
                       local_388.super__Vector_base<Vector2f,_std::allocator<Vector2f>_>._M_impl.
                       super__Vector_impl_data._M_finish,&local_338);
          }
          else {
            *local_388.super__Vector_base<Vector2f,_std::allocator<Vector2f>_>._M_impl.
             super__Vector_impl_data._M_finish = (Vector2f)local_338;
            local_388.super__Vector_base<Vector2f,_std::allocator<Vector2f>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 local_388.super__Vector_base<Vector2f,_std::allocator<Vector2f>_>._M_impl.
                 super__Vector_impl_data._M_finish + 1;
          }
          pVVar9 = pVVar9 + 1;
        } while (pVVar9 != pVVar2);
      }
      pdVar3 = (this_00->ny).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      (this_00->ny).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start =
           (pointer)local_388.super__Vector_base<Vector2f,_std::allocator<Vector2f>_>._M_impl.
                    super__Vector_impl_data._M_start;
      (this_00->ny).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_finish =
           (pointer)local_388.super__Vector_base<Vector2f,_std::allocator<Vector2f>_>._M_impl.
                    super__Vector_impl_data._M_finish;
      (this_00->ny).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           (pointer)local_388.super__Vector_base<Vector2f,_std::allocator<Vector2f>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage;
      local_388.super__Vector_base<Vector2f,_std::allocator<Vector2f>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_388.super__Vector_base<Vector2f,_std::allocator<Vector2f>_>._M_impl.
      super__Vector_impl_data._M_start = (Vector2f *)0x0;
      local_388.super__Vector_base<Vector2f,_std::allocator<Vector2f>_>._M_impl.
      super__Vector_impl_data._M_finish = (Vector2f *)0x0;
      if ((pdVar3 != (pointer)0x0) &&
         (operator_delete(pdVar3),
         local_388.super__Vector_base<Vector2f,_std::allocator<Vector2f>_>._M_impl.
         super__Vector_impl_data._M_start != (Vector2f *)0x0)) {
        operator_delete(local_388.super__Vector_base<Vector2f,_std::allocator<Vector2f>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      uVar7 = local_35c + 1;
      __position._M_current = *(Rotate_BSpline_Segment ***)(local_2f0 + 8);
      auVar18 = vpinsrd_avx(ZEXT416(local_35c),uVar7,1);
      auVar18 = vcvtdq2pd_avx(auVar18);
      auVar18 = vdivpd_avx(auVar18,local_a8);
      auVar18 = vcvtpd2ps_avx(auVar18);
      auVar18 = vcvtps2pd_avx(auVar18);
      this_00->l = (double)auVar18._0_8_;
      this_00->r = (double)auVar18._8_8_;
      local_35c = uVar7;
      if (__position._M_current == *(Rotate_BSpline_Segment ***)(local_2f0 + 0x10)) {
        std::vector<Rotate_BSpline_Segment*,std::allocator<Rotate_BSpline_Segment*>>::
        _M_realloc_insert<Rotate_BSpline_Segment*const&>(local_2f0,__position,&local_2d8);
      }
      else {
        *__position._M_current = local_2d8;
        *(long *)(local_2f0 + 8) = *(long *)(local_2f0 + 8) + 8;
      }
      if (local_358.super__Vector_base<Vector2f,_std::allocator<Vector2f>_>._M_impl.
          super__Vector_impl_data._M_start != (Vector2f *)0x0) {
        operator_delete(local_358.super__Vector_base<Vector2f,_std::allocator<Vector2f>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if (local_328.super__Vector_base<Vector2f,_std::allocator<Vector2f>_>._M_impl.
          super__Vector_impl_data._M_start != (Vector2f *)0x0) {
        operator_delete(local_328.super__Vector_base<Vector2f,_std::allocator<Vector2f>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
    } while (local_35c != (uint)local_2e8);
  }
  std::
  vector<std::vector<Vector2f,_std::allocator<Vector2f>_>,_std::allocator<std::vector<Vector2f,_std::allocator<Vector2f>_>_>_>
  ::~vector(&local_230);
  return (vector<Rotate_BSpline_Segment_*,_std::allocator<Rotate_BSpline_Segment_*>_> *)local_2f0;
}

Assistant:

std::vector<Rotate_BSpline_Segment*> Rotate_BSpline(Vector3f o, std::vector<Vector2f> controls, Material* m, int K=3) {
//	cout << o[0] << ',' << o[1] << "," << o[2] << " | " << controls.size() << "  |  " << m<<" " << K << "?\n";
//	for (auto t : controls) cout << t[0] << "," << t[1] << " "; cout << "?\n";
	using std::vector;
	int N = int(controls.size()) - 1;
	auto tt = [&](int w) {return w * 1.0 / (N + K + 1); };
	vector<vector<Vector2f>> f(N + K + 1);
	std::vector<Rotate_BSpline_Segment*> output;
	for (int g = K; g <= N; ++g) {
		float l = tt(g), r = tt(g + 1);
		for (int j = 0; j < N + K + 1; ++j)
		{
			f[j].clear();
			if (g == j) f[j].push_back(1);
		}
		vector<Vector2f> t;
		for (int x = 1; x <= K; ++x)
		{
			if (x == K)
			{
				for (int j = 0; j < N + K + 1 - x; ++j)
					t = poly_add(t, poly_mul(poly_minus(
						poly_mul(f[j], 1.0 / (tt(j + x) - tt(j))), 
						poly_mul(f[j + 1], 1.0 / (tt(j + x + 1) - tt(j + 1)))), 
						controls[j] * x));
			}
			for (int j = 0; j < N + K + 1 - x; ++j)
				f[j] = poly_add(poly_mul(f[j], poly_mul(
					std::vector<Vector2f>{ Vector2f(-tt(j),-tt(j)),Vector2f(1,1) }, 1.0 / (tt(j + x) - tt(j)))),
				poly_mul(f[j + 1], poly_mul(std::vector<Vector2f>{ 
					Vector2f(tt(j + x + 1), tt(j + x + 1)),Vector2f(-1,-1) }, 1.0 / (tt(j + x + 1) - tt(j + 1)))));
//				f[j] = (g - tt(j)) / (tt(j + x) - tt(j)) * f[j] + (tt(j + x + 1) - g) / (tt(j + x + 1) - tt(j + 1)) * f[j + 1];
		}
		vector<Vector2f> v;
		for (int j = 0; j <= N; ++j)
			v = poly_add(v, poly_mul(f[j], controls[j]));
		auto gx = [](const vector<Vector2f>& t) {
			vector<double> s;
			for (auto g : t)
				s.push_back(g[0]);
			return s;
		};
		auto gy = [](const vector<Vector2f>& t) {
			vector<double> s;
			for (auto g : t)
				s.push_back(g[1]);
			return s;
		};
		Rotate_BSpline_Segment *s_p=new Rotate_BSpline_Segment(m),&s=*s_p;
		s.o = o; s.px = gx(v); s.py = gy(v);
		s.nx = poly_neg(gy(t)); s.ny = gx(t);
		s.l = l; s.r = r; output.push_back(s_p);
	}
//	cerr << K << "," << N << " " << output.size() << "?\n";
	return output;
}